

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

bool __thiscall ThreadContext::AsyncHostOperationStart(ThreadContext *this,void *suspendRecord)

{
  byte bVar1;
  ScriptEntryExitRecord *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (this->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xfd1,"(!this->IsScriptActive())","!this->IsScriptActive()");
    if (!bVar4) goto LAB_007c1671;
    *puVar5 = 0;
  }
  pSVar2 = this->entryExitRecord;
  if (pSVar2 != (ScriptEntryExitRecord *)0x0) {
    bVar1 = *(byte *)pSVar2;
    if ((bVar1 & 8) == 0) {
      *(byte *)pSVar2 = bVar1 | 0x10;
      Js::ScriptContext::ProfileSuspend
                (pSVar2->scriptContext,RunPhase,(SuspendRecord *)suspendRecord);
      return (bool)((bVar1 & 0x10) >> 4);
    }
    if ((bVar1 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xfe1,"(!lastRecord->leaveForAsyncHostOperation)",
                         "!lastRecord->leaveForAsyncHostOperation");
      if (!bVar4) {
LAB_007c1671:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  return false;
}

Assistant:

bool
ThreadContext::AsyncHostOperationStart(void * suspendRecord)
{
    bool wasInAsync = false;
    Assert(!this->IsScriptActive());
    Js::ScriptEntryExitRecord * lastRecord = this->entryExitRecord;
    if (lastRecord != NULL)
    {
        if (!lastRecord->leaveForHost)
        {
#if DBG
            wasInAsync = !!lastRecord->leaveForAsyncHostOperation;
            lastRecord->leaveForAsyncHostOperation = true;
#endif
#ifdef PROFILE_EXEC
            lastRecord->scriptContext->ProfileSuspend(Js::RunPhase, (Js::Profiler::SuspendRecord *)suspendRecord);
#endif
        }
        else
        {
            Assert(!lastRecord->leaveForAsyncHostOperation);
        }
    }
    return wasInAsync;
}